

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O0

ValueEntry * __thiscall rsg::ValueScope::findEntry(ValueScope *this,Variable *variable)

{
  bool bVar1;
  reference ppVVar2;
  ValueEntry *local_50;
  __normal_iterator<rsg::ValueEntry_*const_*,_std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>_>
  local_40;
  CompareEntryVariable local_38;
  __normal_iterator<rsg::ValueEntry_*const_*,_std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>_>
  local_30;
  __normal_iterator<rsg::ValueEntry_*const_*,_std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>_>
  local_28;
  __normal_iterator<rsg::ValueEntry_*const_*,_std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>_>
  local_20;
  const_iterator pos;
  Variable *variable_local;
  ValueScope *this_local;
  
  pos._M_current = (ValueEntry **)variable;
  local_28._M_current =
       (ValueEntry **)
       std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>::begin(&this->m_entries);
  local_30._M_current =
       (ValueEntry **)
       std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>::end(&this->m_entries);
  CompareEntryVariable::CompareEntryVariable(&local_38,(Variable *)pos._M_current);
  local_20 = std::
             find<__gnu_cxx::__normal_iterator<rsg::ValueEntry*const*,std::vector<rsg::ValueEntry*,std::allocator<rsg::ValueEntry*>>>,rsg::CompareEntryVariable>
                       (local_28,local_30,&local_38);
  local_40._M_current =
       (ValueEntry **)
       std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>::end(&this->m_entries);
  bVar1 = __gnu_cxx::operator!=(&local_20,&local_40);
  if (bVar1) {
    ppVVar2 = __gnu_cxx::
              __normal_iterator<rsg::ValueEntry_*const_*,_std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>_>
              ::operator*(&local_20);
    local_50 = *ppVVar2;
  }
  else {
    local_50 = (ValueEntry *)0x0;
  }
  return local_50;
}

Assistant:

ValueEntry* ValueScope::findEntry (const Variable* variable) const
{
	vector<ValueEntry*>::const_iterator pos = std::find(m_entries.begin(), m_entries.end(), CompareEntryVariable(variable));
	return pos != m_entries.end() ? *pos : DE_NULL;
}